

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::InternReadFile
          (ColladaLoader *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  uint index;
  bool bVar1;
  DeadlyImportError *this_00;
  size_type sVar2;
  size_type sVar3;
  size_type __n;
  size_type __n_00;
  aiNode *paVar4;
  size_type sVar5;
  aiMetadata *paVar6;
  reference key;
  reference ppVar7;
  undefined1 local_478 [8];
  SkeletonMeshBuilder hero;
  _Self local_420;
  const_iterator it;
  size_t i;
  size_t numMeta;
  aiMatrix4x4t<float> local_3c8;
  aiMatrix4x4t<float> local_388;
  undefined1 local_345;
  allocator<char> local_331;
  string local_330;
  undefined1 local_310 [8];
  ColladaParser parser;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  ColladaLoader *this_local;
  
  parser._736_8_ = pIOHandler;
  std::__cxx11::string::operator=((string *)&this->mFileName,(string *)pFile);
  std::
  map<Assimp::ColladaMeshIndex,_unsigned_long,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
  ::clear(&this->mMeshIndexByID);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::clear(&this->mMaterialIndexByName);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::clear(&this->mMeshes);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::clear(&this->mTargetMeshes);
  std::
  vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
  ::clear(&this->newMats);
  std::vector<aiLight_*,_std::allocator<aiLight_*>_>::clear(&this->mLights);
  std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::clear(&this->mCameras);
  std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::clear(&this->mTextures);
  std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::clear(&this->mAnims);
  ColladaParser::ColladaParser((ColladaParser *)local_310,(IOSystem *)parser._736_8_,pFile);
  if (parser.mAnimationClipLibrary.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
                    *)&parser.mEffectLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
    ::reserve(&this->newMats,sVar2 * 2);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
                    *)&parser.mAccessorLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&this->mMeshes,sVar3 * 2);
    __n = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>_>_>
                  *)&parser.mLightLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::reserve(&this->mCameras,__n);
    __n_00 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>_>_>
             ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>_>_>
                     *)&parser.mMaterialLibrary._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<aiLight_*,_std::allocator<aiLight_*>_>::reserve(&this->mLights,__n_00);
    BuildMaterials(this,(ColladaParser *)local_310,pScene);
    paVar4 = BuildHierarchy(this,(ColladaParser *)local_310,
                            (Node *)parser.mAnimationClipLibrary.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pScene->mRootNode = paVar4;
    FillMaterials(this,(ColladaParser *)local_310,pScene);
    aiMatrix4x4t<float>::aiMatrix4x4t
              (&local_388,
               parser.mAnims.mSubAnims.
               super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_,0.0,0.0,0.0,0.0,
               parser.mAnims.mSubAnims.
               super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_,0.0,0.0,0.0,0.0,
               parser.mAnims.mSubAnims.
               super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_,0.0,0.0,0.0,0.0,1.0);
    aiMatrix4x4t<float>::operator*=(&pScene->mRootNode->mTransformation,&local_388);
    if ((this->ignoreUpDirection & 1U) == 0) {
      if (parser.mAnims.mSubAnims.
          super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        aiMatrix4x4t<float>::aiMatrix4x4t
                  (&local_3c8,0.0,-1.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0);
        aiMatrix4x4t<float>::operator*=(&pScene->mRootNode->mTransformation,&local_3c8);
      }
      else if (parser.mAnims.mSubAnims.
               super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 2) {
        aiMatrix4x4t<float>::aiMatrix4x4t
                  ((aiMatrix4x4t<float> *)&numMeta,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,-1.0,0.0,0.0,
                   0.0,0.0,0.0,1.0);
        aiMatrix4x4t<float>::operator*=
                  (&pScene->mRootNode->mTransformation,(aiMatrix4x4t<float> *)&numMeta);
      }
    }
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>_>
                     *)&parser.mUnitSize);
    if (!bVar1) {
      sVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>_>
                      *)&parser.mUnitSize);
      i._0_4_ = (uint)sVar5;
      paVar6 = aiMetadata::Alloc((uint)i);
      pScene->mMetaData = paVar6;
      it._M_node = (_Base_ptr)0x0;
      local_420._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>_>
           ::cbegin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>_>
                     *)&parser.mUnitSize);
      while( true ) {
        hero._72_8_ = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>_>
                      ::cend((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>_>
                              *)&parser.mUnitSize);
        bVar1 = std::operator!=(&local_420,(_Self *)&hero.mKnobsOnly);
        if (!bVar1) break;
        paVar6 = pScene->mMetaData;
        index = (uint)it._M_node;
        key = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>
              ::operator*(&local_420);
        ppVar7 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>
                 ::operator*(&local_420);
        aiMetadata::Set<aiString>(paVar6,index,&key->first,&ppVar7->second);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>
        ::operator++(&local_420);
        it._M_node = (_Base_ptr)((long)&(it._M_node)->_M_color + 1);
      }
    }
    StoreSceneMeshes(this,pScene);
    StoreSceneMaterials(this,pScene);
    StoreSceneTextures(this,pScene);
    StoreSceneLights(this,pScene);
    StoreSceneCameras(this,pScene);
    StoreAnimations(this,pScene,(ColladaParser *)local_310);
    if (pScene->mNumMeshes == 0) {
      if ((this->noSkeletonMesh & 1U) == 0) {
        SkeletonMeshBuilder::SkeletonMeshBuilder
                  ((SkeletonMeshBuilder *)local_478,pScene,(aiNode *)0x0,false);
        SkeletonMeshBuilder::~SkeletonMeshBuilder((SkeletonMeshBuilder *)local_478);
      }
      pScene->mFlags = pScene->mFlags | 1;
    }
    ColladaParser::~ColladaParser((ColladaParser *)local_310);
    return;
  }
  local_345 = 1;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"Collada: File came out empty. Something is wrong here.",
             &local_331);
  DeadlyImportError::DeadlyImportError(this_00,&local_330);
  local_345 = 0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void ColladaLoader::InternReadFile(const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    mFileName = pFile;

    // clean all member arrays - just for safety, it should work even if we did not
    mMeshIndexByID.clear();
    mMaterialIndexByName.clear();
    mMeshes.clear();
    mTargetMeshes.clear();
    newMats.clear();
    mLights.clear();
    mCameras.clear();
    mTextures.clear();
    mAnims.clear();

    // parse the input file
    ColladaParser parser(pIOHandler, pFile);


    if( !parser.mRootNode) {
        throw DeadlyImportError( "Collada: File came out empty. Something is wrong here.");
    }

    // reserve some storage to avoid unnecessary reallocs
    newMats.reserve(parser.mMaterialLibrary.size()*2u);
    mMeshes.reserve(parser.mMeshLibrary.size()*2u);

    mCameras.reserve(parser.mCameraLibrary.size());
    mLights.reserve(parser.mLightLibrary.size());

    // create the materials first, for the meshes to find
    BuildMaterials(parser, pScene);

    // build the node hierarchy from it
    pScene->mRootNode = BuildHierarchy(parser, parser.mRootNode);

    // ... then fill the materials with the now adjusted settings
    FillMaterials(parser, pScene);

    // Apply unit-size scale calculation

    pScene->mRootNode->mTransformation *= aiMatrix4x4(parser.mUnitSize, 0,  0,  0,
                                                        0,  parser.mUnitSize,  0,  0,
                                                        0,  0,  parser.mUnitSize,  0,
                                                        0,  0,  0,  1);
    if( !ignoreUpDirection ) {
        // Convert to Y_UP, if different orientation
        if( parser.mUpDirection == ColladaParser::UP_X) {
            pScene->mRootNode->mTransformation *= aiMatrix4x4(
                    0, -1,  0,  0,
                    1,  0,  0,  0,
                    0,  0,  1,  0,
                    0,  0,  0,  1);
        } else if( parser.mUpDirection == ColladaParser::UP_Z) {
            pScene->mRootNode->mTransformation *= aiMatrix4x4(
                    1,  0,  0,  0,
                    0,  0,  1,  0,
                    0, -1,  0,  0,
                    0,  0,  0,  1);
        }
    }

    // Store scene metadata
    if (!parser.mAssetMetaData.empty()) {
        const size_t numMeta(parser.mAssetMetaData.size());
        pScene->mMetaData = aiMetadata::Alloc(static_cast<unsigned int>(numMeta));
        size_t i = 0;
        for (auto it = parser.mAssetMetaData.cbegin(); it != parser.mAssetMetaData.cend(); ++it, ++i) {
            pScene->mMetaData->Set(static_cast<unsigned int>(i), (*it).first, (*it).second);
        }
    }

    // store all meshes
    StoreSceneMeshes(pScene);

    // store all materials
    StoreSceneMaterials(pScene);

    // store all textures
    StoreSceneTextures(pScene);

    // store all lights
    StoreSceneLights(pScene);

    // store all cameras
    StoreSceneCameras(pScene);

    // store all animations
    StoreAnimations(pScene, parser);

    // If no meshes have been loaded, it's probably just an animated skeleton.
    if ( 0u == pScene->mNumMeshes) {

        if (!noSkeletonMesh) {
            SkeletonMeshBuilder hero(pScene);
        }
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }
}